

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O3

void putmbi(int i,_func_void_int_void_ptr *putout,void *out)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (i != 0) {
    iVar1 = 0;
    iVar2 = -7;
    uVar3 = 1;
    do {
      iVar2 = iVar2 + 7;
      iVar1 = iVar1 + (0x7f << ((byte)iVar2 & 0x1f) & i);
      uVar3 = uVar3 + 1;
    } while (iVar1 != i);
    if (iVar2 != 0) {
      do {
        (*putout)((0x7f << ((byte)iVar2 & 0x1f) & i) >> ((byte)iVar2 & 0x1f) | 0x80,out);
        uVar3 = uVar3 - 1;
        iVar2 = iVar2 + -7;
      } while (2 < uVar3);
    }
  }
  (*putout)(i & 0x7f,out);
  return;
}

Assistant:

void putmbi(int i, void (*putout)(int c, void *out), void *out)
{
	int cnt, l, accu;

	/* Get number of septets */
	accu = cnt = 0;
	while(accu != i) {
		accu += i & 0x7f << 7 * cnt++;
	}

	/* Produce the multibyte output */
	for(l = cnt - 1; l > 0; l--) {
		putout(0x80 | (i & 0x7f << 7 * l) >> 7 * l, out);
	}

	putout(i & 0x7f, out);
}